

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O0

sptr_t wal_write_q2(sptr_t buf,image_data *im)

{
  sptr_t sVar1;
  uint8_t *offsets_00;
  sptr_t sVar2;
  uint32_t *offsets;
  uchar *ptr;
  image_data *piStack_30;
  int i;
  image_data *im_local;
  sptr_t buf_local;
  
  buf_local.ptr = (uchar *)buf.size;
  offsets = (uint32_t *)buf.ptr;
  offsets_00 = &((image_data *)offsets)->type;
  piStack_30 = im;
  im_local = (image_data *)offsets;
  memset(offsets,0,0x20);
  offsets = offsets + 8;
  write_le32(piStack_30->width,(uchar **)&offsets);
  write_le32(piStack_30->height,(uchar **)&offsets);
  offsets = offsets + 4;
  memset(offsets,0,0x20);
  offsets = offsets + 8;
  write_le32(0,(uchar **)&offsets);
  write_le32(0,(uchar **)&offsets);
  write_le32(0,(uchar **)&offsets);
  sVar2.size = (size_t)buf_local.ptr;
  sVar2.ptr = (uchar *)im_local;
  sVar2 = sptr_advance(sVar2,100);
  wal_write_mips(sVar2,piStack_30,4,(uint32_t *)offsets_00);
  for (ptr._4_4_ = 0; ptr._4_4_ < 4; ptr._4_4_ = ptr._4_4_ + 1) {
    *(int *)(offsets_00 + (long)ptr._4_4_ * 4) = *(int *)(offsets_00 + (long)ptr._4_4_ * 4) + 100;
  }
  sVar1.size = (size_t)buf_local.ptr;
  sVar1.ptr = (uchar *)im_local;
  return sVar1;
}

Assistant:

static sptr_t wal_write_q2(sptr_t buf, const struct image_data *im)
{
	int i;
	unsigned char *ptr = buf.ptr;
	uint32_t *offsets = (uint32_t *)(buf.ptr + 40);
	memset(ptr, 0, NAME_LEN); // name
	ptr += NAME_LEN;
	write_le32(im->width, &ptr);
	write_le32(im->height, &ptr);
	ptr += sizeof(uint32_t) * MIP_LEVELS_Q2; // offsets will be filled later
	memset(ptr, 0, NAME_LEN);				 // animname
	ptr += NAME_LEN;
	write_le32(0, &ptr); // flags
	write_le32(0, &ptr); // contents
	write_le32(0, &ptr); // value
	wal_write_mips(sptr_advance(buf, WAL_Q2_HEADER_SIZE), im, MIP_LEVELS_Q2,
				   offsets);
	for (i = 0; i < MIP_LEVELS_Q2; i++) {
		offsets[i] += WAL_Q2_HEADER_SIZE;
	}
	return buf;
}